

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

Expr to_lower(pExecutor exec,pContext_conflict defContext,pContext_conflict callContext,Expr *args,
             int argc)

{
  _Bool _Var1;
  ValueType VVar2;
  pString value;
  __int32_t **pp_Var3;
  char *__s;
  Expr EVar5;
  Expr EVar6;
  Expr expr;
  Expr ptr;
  Expr expr_00;
  Expr expr_01;
  Expr expr_02;
  anon_union_8_8_707b72ea_for_Expr_1 aVar4;
  
  hlp_check_args_count(argc,1,1,"to-lower");
  EVar5._4_4_ = 0;
  EVar5.type = args->type;
  EVar5.field_1.val_atom = (args->field_1).val_atom;
  EVar5 = exec_eval(exec,callContext,EVar5);
  aVar4 = EVar5.field_1;
  expr._4_4_ = 0;
  expr.type = EVar5.type;
  expr.field_1.val_atom = aVar4.val_atom;
  _Var1 = is_string(expr);
  ptr._0_8_ = CONCAT44(0,EVar5.type);
  if (_Var1) {
    ptr.field_1.val_atom = aVar4.val_atom;
    EVar5 = dereference(ptr);
    value = string_to_lower(EVar5.field_1.val_str);
    if (value == (pString)0x0) {
      __s = "to-lower: string_to_lower failed";
    }
    else {
      EVar5 = make_string(exec,value);
      aVar4 = EVar5.field_1;
      VVar2 = EVar5.type;
      free_string(value);
      expr_00._4_4_ = 0;
      expr_00.type = VVar2;
      expr_00.field_1.val_atom = aVar4.val_atom;
      _Var1 = is_none(expr_00);
      if (!_Var1) {
LAB_001066ca:
        EVar6._4_4_ = 0;
        EVar6.type = VVar2;
        EVar6.field_1.val_atom = aVar4.val_atom;
        return EVar6;
      }
      __s = "to-lower: make_string failed";
    }
  }
  else {
    expr_01.field_1.val_atom = aVar4.val_atom;
    expr_01._0_8_ = ptr._0_8_;
    _Var1 = is_char(expr_01);
    if (_Var1) {
      pp_Var3 = __ctype_tolower_loc();
      EVar5 = make_char(exec,(char)(*pp_Var3)[EVar5.field_1._0_1_]);
      aVar4 = EVar5.field_1;
      VVar2 = EVar5.type;
      expr_02._4_4_ = 0;
      expr_02.type = VVar2;
      expr_02.field_1.val_atom = aVar4.val_atom;
      _Var1 = is_none(expr_02);
      if (!_Var1) goto LAB_001066ca;
      __s = "to-lower: make_char failed";
    }
    else {
      __s = "to-lower: argument not a string or char";
    }
  }
  puts(__s);
  exit(1);
}

Assistant:

BUILTIN_FUNC(to_lower)
{
    hlp_check_args_count(argc, 1, 1, "to-lower");
    Expr arg = EVAL_ARG(0);

    if (is_string(arg))
    {
        pString res_str = string_to_lower(dereference(arg).val_str);
        if (res_str == NULL)
        {
            log("to-lower: string_to_lower failed");
            exit(1);
        }
        Expr res = make_string(exec, res_str);
        free_string(res_str);
        if (is_none(res))
        {
            log("to-lower: make_string failed");
            exit(1);
        }
        return res;
    }
    else if (is_char(arg))
    {
        char res_char = (char) tolower(arg.val_char);
        Expr res = make_char(exec, res_char);
        if (is_none(res))
        {
            log("to-lower: make_char failed");
            exit(1);
        }
        return res;
    }
    else
    {
        log("to-lower: argument not a string or char");
        exit(1);
    }
}